

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpush.c
# Opt level: O2

int nn_xpush_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_lb_data *data;
  char *pcVar1;
  undefined8 uStack_30;
  int sndprio;
  size_t sz;
  
  sz = 4;
  nn_pipe_getopt(pipe,0,8,&sndprio,&sz);
  if (sz == 4) {
    if (0xffffffef < sndprio - 0x11U) {
      data = (nn_lb_data *)nn_alloc_(0x20);
      if (data != (nn_lb_data *)0x0) {
        nn_pipe_setdata(pipe,data);
        nn_lb_add((nn_lb *)(self + 1),data,pipe,sndprio);
        return 0;
      }
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pipeline/xpush.c"
              ,0x73);
      goto LAB_0011a3ce;
    }
    pcVar1 = "sndprio >= 1 && sndprio <= 16";
    uStack_30 = 0x70;
  }
  else {
    pcVar1 = "sz == sizeof (sndprio)";
    uStack_30 = 0x6f;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pipeline/xpush.c"
          ,uStack_30);
LAB_0011a3ce:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_xpush_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpush *xpush;
    struct nn_xpush_data *data;
    int sndprio;
    size_t sz;

    xpush = nn_cont (self, struct nn_xpush, sockbase);

    sz = sizeof (sndprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_SNDPRIO, &sndprio, &sz);
    nn_assert (sz == sizeof (sndprio));
    nn_assert (sndprio >= 1 && sndprio <= 16);

    data = nn_alloc (sizeof (struct nn_xpush_data), "pipe data (push)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_lb_add (&xpush->lb, &data->lb, pipe, sndprio);

    return 0;
}